

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_address.cpp
# Opt level: O3

void __thiscall
AddressFactory_Constructor_type_Test::TestBody(AddressFactory_Constructor_type_Test *this)

{
  pointer pAVar1;
  bool bVar2;
  char *pcVar3;
  AssertionResult gtest_ar;
  AddressFactory factory_7;
  Pubkey pubkey;
  AddressFactory factory;
  Message local_7d8;
  AssertHelper local_7d0;
  AssertHelper local_7c8;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_7c0;
  AddressFactory local_7b8;
  Pubkey local_790;
  undefined1 local_778 [16];
  undefined1 local_768 [32];
  pointer local_748;
  pointer local_730;
  pointer local_718;
  TapBranch local_700;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_688;
  Script local_670;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_630;
  Address local_600;
  Address local_488;
  Address local_310;
  Address local_198;
  
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kMainnet);
      local_778._0_8_ = &PTR__AddressFactory_007215c8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )local_768);
    }
  }
  else {
    testing::Message::Message((Message *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x2b,
               "Expected: AddressFactory factory(NetType::kMainnet) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_7b8,(Message *)local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_778._0_8_ + 8))();
      }
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kTestnet);
      local_778._0_8_ = &PTR__AddressFactory_007215c8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )local_768);
    }
  }
  else {
    testing::Message::Message((Message *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x2c,
               "Expected: AddressFactory factory(NetType::kTestnet) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_7b8,(Message *)local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_778._0_8_ + 8))();
      }
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kRegtest);
      local_778._0_8_ = &PTR__AddressFactory_007215c8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )local_768);
    }
  }
  else {
    testing::Message::Message((Message *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x2d,
               "Expected: AddressFactory factory(NetType::kRegtest) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_7b8,(Message *)local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_778._0_8_ + 8))();
      }
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kLiquidV1);
      local_778._0_8_ = &PTR__AddressFactory_007215c8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )local_768);
    }
  }
  else {
    testing::Message::Message((Message *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x2e,
               "Expected: AddressFactory factory(NetType::kLiquidV1) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_7b8,(Message *)local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_778._0_8_ + 8))();
      }
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kElementsRegtest);
      local_778._0_8_ = &PTR__AddressFactory_007215c8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )local_768);
    }
  }
  else {
    testing::Message::Message((Message *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x2f,
               "Expected: AddressFactory factory(NetType::kElementsRegtest) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_7b8,(Message *)local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_778._0_8_ + 8))();
      }
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kCustomChain);
      local_778._0_8_ = &PTR__AddressFactory_007215c8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )local_768);
    }
  }
  else {
    testing::Message::Message((Message *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x30,
               "Expected: AddressFactory factory(NetType::kCustomChain) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_7b8,(Message *)local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_778._0_8_ + 8))();
      }
    }
  }
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    bVar2 = testing::internal::AlwaysTrue();
    if (bVar2) {
      cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kCustomChain);
      local_778._0_8_ = &PTR__AddressFactory_007215c8;
      std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::
      ~vector((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *
              )local_768);
    }
  }
  else {
    testing::Message::Message((Message *)local_778);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_7b8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x31,
               "Expected: AddressFactory factory(NetType::kNetTypeNum) doesn\'t throw an exception.\n  Actual: it throws."
              );
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_7b8,(Message *)local_778);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_7b8);
    if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
        != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_
          != (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)) {
        (**(code **)(*(_func_int **)local_778._0_8_ + 8))();
      }
    }
  }
  local_778._0_8_ =
       (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_778,
             "027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af","");
  cfd::core::Pubkey::Pubkey(&local_790,(string *)local_778);
  if ((basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_778._0_8_ !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_768) {
    operator_delete((void *)local_778._0_8_);
  }
  cfd::AddressFactory::AddressFactory(&local_7b8,kMainnet);
  cfd::AddressFactory::CreateP2pkhAddress((Address *)local_778,&local_7b8,&local_790);
  local_7d8.ss_.ptr_._0_4_ = local_778._0_4_;
  local_7d0.data_._0_4_ = 0;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&local_7c8,"address.GetNetType()","NetType::kMainnet",(NetType *)&local_7d8
             ,(NetType *)&local_7d0);
  if (local_7c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_7d8);
    if (local_7c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_7c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x38,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    if (CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_7d8.ss_.ptr_._0_4_ = local_778._8_4_;
  local_7d0.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&local_7c8,"address.GetWitnessVersion()","WitnessVersion::kVersionNone",
             (WitnessVersion *)&local_7d8,(WitnessVersion *)&local_7d0);
  if (local_7c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_7d8);
    if (local_7c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_7c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x39,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    if (CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_630);
  cfd::core::Script::~Script(&local_670);
  local_700._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_688);
  cfd::core::TapBranch::~TapBranch(&local_700);
  if (local_718 != (pointer)0x0) {
    operator_delete(local_718);
  }
  if (local_730 != (pointer)0x0) {
    operator_delete(local_730);
  }
  if (local_748 != (pointer)0x0) {
    operator_delete(local_748);
  }
  pAVar1 = (pointer)(local_768 + 0x10);
  if ((pointer)local_768._0_8_ != pAVar1) {
    operator_delete((void *)local_768._0_8_);
  }
  local_7b8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_7b8.prefix_list_);
  cfd::AddressFactory::AddressFactory(&local_7b8,kTestnet);
  cfd::AddressFactory::CreateP2pkhAddress((Address *)local_778,&local_7b8,&local_790);
  local_7d8.ss_.ptr_._0_4_ = local_778._0_4_;
  local_7d0.data_._0_4_ = 1;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&local_7c8,"address.GetNetType()","NetType::kTestnet",(NetType *)&local_7d8
             ,(NetType *)&local_7d0);
  if (local_7c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_7d8);
    if (local_7c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_7c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x3e,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    if (CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_7d8.ss_.ptr_._0_4_ = local_778._8_4_;
  local_7d0.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&local_7c8,"address.GetWitnessVersion()","WitnessVersion::kVersionNone",
             (WitnessVersion *)&local_7d8,(WitnessVersion *)&local_7d0);
  if (local_7c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_7d8);
    if (local_7c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_7c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x3f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    if (CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_630);
  cfd::core::Script::~Script(&local_670);
  local_700._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_688);
  cfd::core::TapBranch::~TapBranch(&local_700);
  if (local_718 != (pointer)0x0) {
    operator_delete(local_718);
  }
  if (local_730 != (pointer)0x0) {
    operator_delete(local_730);
  }
  if (local_748 != (pointer)0x0) {
    operator_delete(local_748);
  }
  if ((pointer)local_768._0_8_ != pAVar1) {
    operator_delete((void *)local_768._0_8_);
  }
  local_7b8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_7b8.prefix_list_);
  cfd::AddressFactory::AddressFactory(&local_7b8,kRegtest);
  cfd::AddressFactory::CreateP2pkhAddress((Address *)local_778,&local_7b8,&local_790);
  local_7d8.ss_.ptr_._0_4_ = local_778._0_4_;
  local_7d0.data_._0_4_ = 2;
  testing::internal::CmpHelperEQ<cfd::core::NetType,cfd::core::NetType>
            ((internal *)&local_7c8,"address.GetNetType()","NetType::kRegtest",(NetType *)&local_7d8
             ,(NetType *)&local_7d0);
  if (local_7c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_7d8);
    if (local_7c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_7c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x44,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    if (CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_7d8.ss_.ptr_._0_4_ = local_778._8_4_;
  local_7d0.data_._0_4_ = 0xffffffff;
  testing::internal::CmpHelperEQ<cfd::core::WitnessVersion,cfd::core::WitnessVersion>
            ((internal *)&local_7c8,"address.GetWitnessVersion()","WitnessVersion::kVersionNone",
             (WitnessVersion *)&local_7d8,(WitnessVersion *)&local_7d0);
  if (local_7c8.data_._0_1_ == (internal)0x0) {
    testing::Message::Message(&local_7d8);
    if (local_7c0.ptr_ == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
    {
      pcVar3 = "";
    }
    else {
      pcVar3 = ((local_7c0.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_7d0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
               ,0x45,pcVar3);
    testing::internal::AssertHelper::operator=(&local_7d0,&local_7d8);
    testing::internal::AssertHelper::~AssertHelper(&local_7d0);
    if (CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != 0) {
      bVar2 = testing::internal::IsTrue(true);
      if ((bVar2) &&
         ((long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_7d8.ss_.ptr_._4_4_,(NetType)local_7d8.ss_.ptr_) + 8))()
        ;
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_7c0,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_630);
  cfd::core::Script::~Script(&local_670);
  local_700._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_688);
  cfd::core::TapBranch::~TapBranch(&local_700);
  if (local_718 != (pointer)0x0) {
    operator_delete(local_718);
  }
  if (local_730 != (pointer)0x0) {
    operator_delete(local_730);
  }
  if (local_748 != (pointer)0x0) {
    operator_delete(local_748);
  }
  if ((pointer)local_768._0_8_ != pAVar1) {
    operator_delete((void *)local_768._0_8_);
  }
  local_7b8._vptr_AddressFactory = (_func_int **)&PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            (&local_7b8.prefix_list_);
  cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kLiquidV1);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::AddressFactory::CreateP2pkhAddress(&local_198,(AddressFactory *)local_778,&local_790);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_198.format_data_);
    cfd::core::Script::~Script(&local_198.redeem_script_);
    local_198.script_tree_.super_TapBranch._vptr_TapBranch =
         (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_198.script_tree_.nodes_);
    cfd::core::TapBranch::~TapBranch(&local_198.script_tree_.super_TapBranch);
    if (local_198.schnorr_pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.schnorr_pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_198.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_198.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_198.hash_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_198.address_._M_dataplus._M_p != &local_198.address_.field_2) {
      operator_delete(local_198.address_._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_7b8);
  testing::internal::AssertHelper::AssertHelper
            (&local_7c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
             ,0x49,
             "Expected: factory.CreateP2pkhAddress(pubkey) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_7c8,(Message *)&local_7b8);
  testing::internal::AssertHelper::~AssertHelper(&local_7c8);
  if (local_7b8._vptr_AddressFactory != (_func_int **)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (local_7b8._vptr_AddressFactory != (_func_int **)0x0)) {
      (**(code **)(*local_7b8._vptr_AddressFactory + 8))();
    }
  }
  local_778._0_8_ = &PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_768);
  cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kElementsRegtest);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::AddressFactory::CreateP2pkhAddress(&local_310,(AddressFactory *)local_778,&local_790);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_310.format_data_);
    cfd::core::Script::~Script(&local_310.redeem_script_);
    local_310.script_tree_.super_TapBranch._vptr_TapBranch =
         (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_310.script_tree_.nodes_);
    cfd::core::TapBranch::~TapBranch(&local_310.script_tree_.super_TapBranch);
    if (local_310.schnorr_pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_310.schnorr_pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_310.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_310.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_310.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_310.hash_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_310.address_._M_dataplus._M_p != &local_310.address_.field_2) {
      operator_delete(local_310.address_._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_7b8);
  testing::internal::AssertHelper::AssertHelper
            (&local_7c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
             ,0x4d,
             "Expected: factory.CreateP2pkhAddress(pubkey) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_7c8,(Message *)&local_7b8);
  testing::internal::AssertHelper::~AssertHelper(&local_7c8);
  if (local_7b8._vptr_AddressFactory != (_func_int **)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (local_7b8._vptr_AddressFactory != (_func_int **)0x0)) {
      (**(code **)(*local_7b8._vptr_AddressFactory + 8))();
    }
  }
  local_778._0_8_ = &PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_768);
  cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kCustomChain);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::AddressFactory::CreateP2pkhAddress(&local_488,(AddressFactory *)local_778,&local_790);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_488.format_data_);
    cfd::core::Script::~Script(&local_488.redeem_script_);
    local_488.script_tree_.super_TapBranch._vptr_TapBranch =
         (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_488.script_tree_.nodes_);
    cfd::core::TapBranch::~TapBranch(&local_488.script_tree_.super_TapBranch);
    if (local_488.schnorr_pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_488.schnorr_pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_488.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_488.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_488.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_488.hash_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_488.address_._M_dataplus._M_p != &local_488.address_.field_2) {
      operator_delete(local_488.address_._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_7b8);
  testing::internal::AssertHelper::AssertHelper
            (&local_7c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
             ,0x51,
             "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_7c8,(Message *)&local_7b8);
  testing::internal::AssertHelper::~AssertHelper(&local_7c8);
  if (local_7b8._vptr_AddressFactory != (_func_int **)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (local_7b8._vptr_AddressFactory != (_func_int **)0x0)) {
      (**(code **)(*local_7b8._vptr_AddressFactory + 8))();
    }
  }
  local_778._0_8_ = &PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_768);
  cfd::AddressFactory::AddressFactory((AddressFactory *)local_778,kCustomChain);
  bVar2 = testing::internal::AlwaysTrue();
  if (bVar2) {
    cfd::AddressFactory::CreateP2pkhAddress(&local_600,(AddressFactory *)local_778,&local_790);
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 *)&local_600.format_data_);
    cfd::core::Script::~Script(&local_600.redeem_script_);
    local_600.script_tree_.super_TapBranch._vptr_TapBranch =
         (_func_int **)&PTR__TaprootScriptTree_0072eb30;
    std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector
              (&local_600.script_tree_.nodes_);
    cfd::core::TapBranch::~TapBranch(&local_600.script_tree_.super_TapBranch);
    if (local_600.schnorr_pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_600.schnorr_pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_600.pubkey_.data_.data_.
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_600.pubkey_.data_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (local_600.hash_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_600.hash_.data_.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_600.address_._M_dataplus._M_p != &local_600.address_.field_2) {
      operator_delete(local_600.address_._M_dataplus._M_p);
    }
  }
  testing::Message::Message((Message *)&local_7b8);
  testing::internal::AssertHelper::AssertHelper
            (&local_7c8,kNonFatalFailure,
             "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd-go/external/cfd/test/test_cfd_address.cpp"
             ,0x55,
             "Expected: (factory.CreateP2pkhAddress(pubkey)) throws an exception of type CfdException.\n  Actual: it throws nothing."
            );
  testing::internal::AssertHelper::operator=(&local_7c8,(Message *)&local_7b8);
  testing::internal::AssertHelper::~AssertHelper(&local_7c8);
  if (local_7b8._vptr_AddressFactory != (_func_int **)0x0) {
    bVar2 = testing::internal::IsTrue(true);
    if ((bVar2) && (local_7b8._vptr_AddressFactory != (_func_int **)0x0)) {
      (**(code **)(*local_7b8._vptr_AddressFactory + 8))();
    }
  }
  local_778._0_8_ = &PTR__AddressFactory_007215c8;
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_768);
  if (local_790.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_790.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  return;
}

Assistant:

TEST(AddressFactory, Constructor_type)
{
  EXPECT_NO_THROW(AddressFactory factory(NetType::kMainnet));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kTestnet));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kRegtest));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kLiquidV1));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kElementsRegtest));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kCustomChain));
  EXPECT_NO_THROW(AddressFactory factory(NetType::kNetTypeNum));

  Pubkey pubkey = Pubkey("027592aab5d43618dda13fba71e3993cd7517a712d3da49664c06ee1bd3d1f70af");

  {
    AddressFactory factory(NetType::kMainnet);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kMainnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kTestnet);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kTestnet);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kRegtest);
    Address address = factory.CreateP2pkhAddress(pubkey);
    EXPECT_EQ(address.GetNetType(), NetType::kRegtest);
    EXPECT_EQ(address.GetWitnessVersion(), WitnessVersion::kVersionNone);
  }
  {
    AddressFactory factory(NetType::kLiquidV1);
    EXPECT_THROW(factory.CreateP2pkhAddress(pubkey), CfdException);
  }
  {
    AddressFactory factory(NetType::kElementsRegtest);
    EXPECT_THROW(factory.CreateP2pkhAddress(pubkey), CfdException);
  }
  {
    AddressFactory factory(NetType::kCustomChain);
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
  {
    AddressFactory factory(NetType::kNetTypeNum);
    EXPECT_THROW((factory.CreateP2pkhAddress(pubkey)), CfdException);
  }
}